

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

void __thiscall rlottie::internal::renderer::CompLayer::preprocessStage(CompLayer *this,VRect *clip)

{
  bool bVar1;
  iterator this_00;
  reference ppLVar2;
  Layer *in_RDI;
  Layer **layer;
  iterator __end1;
  iterator __begin1;
  vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
  *__range1;
  Layer *matte;
  VRect *in_stack_ffffffffffffffb8;
  VRect *in_stack_ffffffffffffffc8;
  Clipper *in_stack_ffffffffffffffd0;
  __normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
  local_28;
  Layer *local_20;
  Layer *local_18;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
                      *)0x160b91);
  if (bVar1) {
    std::
    unique_ptr<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
    ::operator->((unique_ptr<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
                  *)0x160ba5);
    Clipper::preprocess(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  local_18 = (Layer *)0x0;
  local_20 = in_RDI + 1;
  local_28._M_current =
       (Layer **)
       std::
       vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
       ::begin((vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
                *)in_stack_ffffffffffffffb8);
  this_00 = std::
            vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
            ::end((vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
                   *)in_stack_ffffffffffffffb8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
                             *)in_RDI,
                            (__normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
                             *)in_stack_ffffffffffffffb8), bVar1) {
    ppLVar2 = __gnu_cxx::
              __normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
              ::operator*(&local_28);
    bVar1 = Layer::hasMatte(*ppLVar2);
    if (bVar1) {
      local_18 = *ppLVar2;
    }
    else {
      bVar1 = Layer::visible((Layer *)this_00._M_current);
      if (bVar1) {
        if (local_18 == (Layer *)0x0) {
          Layer::preprocess(in_RDI,in_stack_ffffffffffffffb8);
        }
        else {
          bVar1 = Layer::visible((Layer *)this_00._M_current);
          if (bVar1) {
            Layer::preprocess(in_RDI,in_stack_ffffffffffffffb8);
            Layer::preprocess(in_RDI,in_stack_ffffffffffffffb8);
          }
        }
      }
      local_18 = (Layer *)0x0;
    }
    __gnu_cxx::
    __normal_iterator<rlottie::internal::renderer::Layer_**,_std::vector<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void renderer::CompLayer::preprocessStage(const VRect &clip)
{
    // if layer has clipper
    if (mClipper) mClipper->preprocess(clip);

    renderer::Layer *matte = nullptr;
    for (const auto &layer : mLayers) {
        if (layer->hasMatte()) {
            matte = layer;
        } else {
            if (layer->visible()) {
                if (matte) {
                    if (matte->visible()) {
                        layer->preprocess(clip);
                        matte->preprocess(clip);
                    }
                } else {
                    layer->preprocess(clip);
                }
            }
            matte = nullptr;
        }
    }
}